

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_peread.c
# Opt level: O1

int load_optional_header32
              (dwarf_pe_object_access_internals_t *pep,Dwarf_Unsigned offset,int *errcode)

{
  int iVar1;
  IMAGE_OPTIONAL_HEADER32_dw hdr;
  char acStack_f8 [2];
  uchar local_f6;
  uchar local_f5;
  undefined1 local_f4 [24];
  undefined1 local_dc [28];
  undefined1 local_c0 [4];
  undefined1 local_bc [164];
  
  pep->pe_optional_header_size = 0xe0;
  if (pep->pe_filesize < offset + 0xe0) {
    *errcode = 0x1a7;
    iVar1 = 1;
  }
  else {
    iVar1 = _dwarf_object_read_random(pep->pe_fd,acStack_f8,offset,0xe0,pep->pe_filesize,errcode);
    if (iVar1 == 0) {
      iVar1 = 0;
      (pep->pe_OptionalHeader).Magic = 0;
      (*pep->pe_copy_word)(&pep->pe_OptionalHeader,acStack_f8,2);
      (pep->pe_OptionalHeader).MajorLinkerVersion = local_f6;
      (pep->pe_OptionalHeader).MinorLinkerVersion = local_f5;
      (pep->pe_OptionalHeader).ImageBase = 0;
      (*pep->pe_copy_word)(&(pep->pe_OptionalHeader).ImageBase,local_dc,4);
      (pep->pe_OptionalHeader).SizeOfCode = 0;
      (*pep->pe_copy_word)(&(pep->pe_OptionalHeader).SizeOfCode,local_f4,4);
      (pep->pe_OptionalHeader).SizeOfImage = 0;
      (*pep->pe_copy_word)(&(pep->pe_OptionalHeader).SizeOfImage,local_c0,4);
      (pep->pe_OptionalHeader).SizeOfHeaders = 0;
      (*pep->pe_copy_word)(&(pep->pe_OptionalHeader).SizeOfHeaders,local_bc,4);
      (pep->pe_OptionalHeader).SizeOfDataDirEntry = 8;
    }
  }
  return iVar1;
}

Assistant:

static int
load_optional_header32(dwarf_pe_object_access_internals_t *pep,
    Dwarf_Unsigned offset, int*errcode)
{
    int res = 0;
    IMAGE_OPTIONAL_HEADER32_dw hdr;

    pep->pe_optional_header_size = sizeof(IMAGE_OPTIONAL_HEADER32_dw);

    if ((pep->pe_optional_header_size + offset) >
        pep->pe_filesize) {
        *errcode = DW_DLE_FILE_TOO_SMALL;
        return DW_DLV_ERROR;
    }

    res =  _dwarf_object_read_random(pep->pe_fd,
        (char *)&hdr,
        offset, sizeof(IMAGE_OPTIONAL_HEADER32_dw),
        pep->pe_filesize,
        errcode);
    if (res != DW_DLV_OK) {
        return res;
    }

    /* This is a subset of fields. */
    ASNAR(pep->pe_copy_word,pep->pe_OptionalHeader.Magic,
        hdr.Magic);
    pep->pe_OptionalHeader.MajorLinkerVersion= hdr.MajorLinkerVersion;
    pep->pe_OptionalHeader.MinorLinkerVersion= hdr.MinorLinkerVersion;
    ASNAR(pep->pe_copy_word,pep->pe_OptionalHeader.ImageBase,
        hdr.ImageBase);
    ASNAR(pep->pe_copy_word,pep->pe_OptionalHeader.SizeOfCode,
        hdr.SizeOfCode);
    ASNAR(pep->pe_copy_word,pep->pe_OptionalHeader.SizeOfImage,
        hdr.SizeOfImage);
    ASNAR(pep->pe_copy_word,pep->pe_OptionalHeader.SizeOfHeaders,
        hdr.SizeOfHeaders);
    pep->pe_OptionalHeader.SizeOfDataDirEntry =
        sizeof(IMAGE_DATA_DIRECTORY_dw);
    return DW_DLV_OK;
}